

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

string * __thiscall
Catch::toString_abi_cxx11_(string *__return_storage_ptr__,Catch *this,bool value)

{
  char *pcVar1;
  allocator local_9;
  
  pcVar1 = "false";
  if ((int)this != 0) {
    pcVar1 = "true";
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string toString( bool value ) {
    return value ? "true" : "false";
}